

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int balance(BtCursor *pCur)

{
  short sVar1;
  undefined8 uVar2;
  uint uVar3;
  int iVar4;
  void *pvVar5;
  MemPage *in_RDI;
  bool bVar6;
  u8 *pSpace;
  int iIdx;
  MemPage *pParent;
  MemPage *pPage;
  int iPage;
  u8 *pFree;
  u8 aBalanceQuickSpace [13];
  int nMin;
  int rc;
  int in_stack_00000280;
  int in_stack_00000284;
  u8 *in_stack_00000288;
  int in_stack_00000294;
  MemPage *in_stack_00000298;
  PgHdr *in_stack_ffffffffffffffa8;
  MemPage **in_stack_ffffffffffffffc0;
  MemPage *pRoot;
  void *local_28;
  u8 *in_stack_ffffffffffffffe8;
  int iVar7;
  
  iVar7 = 0;
  uVar3 = (uint)(*(int *)(*(long *)(in_RDI->aiOvfl + 3) + 0x34) << 1) / 3;
  local_28 = (void *)0x0;
  do {
    iVar4 = (int)*(char *)((long)&in_RDI->aData + 4);
    pRoot = *(MemPage **)(in_RDI + 1);
    if (iVar4 == 0) {
      if (pRoot->nOverflow == '\0') break;
      iVar7 = balance_deeper(pRoot,in_stack_ffffffffffffffc0);
      if (iVar7 == 0) {
        *(undefined1 *)((long)&in_RDI->aData + 4) = 1;
        *(undefined2 *)((long)&in_RDI->aData + 6) = 0;
        *(undefined2 *)&in_RDI->aDataEnd = 0;
        *(MemPage **)&in_RDI[1].leaf = pRoot;
        uVar2._0_2_ = in_RDI[1].minLocal;
        uVar2._2_2_ = in_RDI[1].cellOffset;
        uVar2._4_2_ = in_RDI[1].nFree;
        uVar2._6_2_ = in_RDI[1].nCell;
        in_RDI[1].isInit = (char)(undefined2)uVar2;
        in_RDI[1].bBusy = (char)((ulong)uVar2 >> 8);
        in_RDI[1].intKey = (char)((ulong)uVar2 >> 0x10);
        in_RDI[1].intKeyLeaf = (char)((ulong)uVar2 >> 0x18);
        in_RDI[1].pgno = (int)((ulong)uVar2 >> 0x20);
      }
    }
    else {
      if ((pRoot->nOverflow == '\0') && ((int)(uint)pRoot->nFree <= (int)uVar3)) break;
      in_stack_ffffffffffffffc0 = *(MemPage ***)(in_RDI[1].aiOvfl + (long)(iVar4 + -1) * 4 + -9);
      sVar1 = *(short *)((long)in_RDI->apOvfl + (long)(iVar4 + -1) * 2 + 0x30);
      iVar7 = sqlite3PagerWrite(in_stack_ffffffffffffffa8);
      if (iVar7 == 0) {
        if ((((pRoot->intKeyLeaf == '\0') || (pRoot->nOverflow != '\x01')) ||
            (pRoot->aiOvfl[0] != pRoot->nCell)) ||
           ((*(int *)((long)in_stack_ffffffffffffffc0 + 4) == 1 ||
            (*(short *)((long)in_stack_ffffffffffffffc0 + 0x16) != sVar1)))) {
          pvVar5 = sqlite3PageMalloc(0);
          iVar7 = balance_nonroot(in_stack_00000298,in_stack_00000294,in_stack_00000288,
                                  in_stack_00000284,in_stack_00000280);
          bVar6 = local_28 != (void *)0x0;
          local_28 = pvVar5;
          if (bVar6) {
            sqlite3PageFree((void *)0x171fe5);
          }
        }
        else {
          iVar7 = balance_quick(in_RDI,(MemPage *)(ulong)uVar3,in_stack_ffffffffffffffe8);
        }
      }
      pRoot->nOverflow = '\0';
      releasePage((MemPage *)0x172004);
      *(char *)((long)&in_RDI->aData + 4) = *(char *)((long)&in_RDI->aData + 4) + -1;
      uVar2 = *(undefined8 *)(in_RDI[1].aiOvfl + (long)*(char *)((long)&in_RDI->aData + 4) * 4 + -9)
      ;
      in_RDI[1].isInit = (char)uVar2;
      in_RDI[1].bBusy = (char)((ulong)uVar2 >> 8);
      in_RDI[1].intKey = (char)((ulong)uVar2 >> 0x10);
      in_RDI[1].intKeyLeaf = (char)((ulong)uVar2 >> 0x18);
      in_RDI[1].pgno = (int)((ulong)uVar2 >> 0x20);
    }
  } while (iVar7 == 0);
  if (local_28 != (void *)0x0) {
    sqlite3PageFree((void *)0x172056);
  }
  return iVar7;
}

Assistant:

static int balance(BtCursor *pCur){
  int rc = SQLITE_OK;
  const int nMin = pCur->pBt->usableSize * 2 / 3;
  u8 aBalanceQuickSpace[13];
  u8 *pFree = 0;

  VVA_ONLY( int balance_quick_called = 0 );
  VVA_ONLY( int balance_deeper_called = 0 );

  do {
    int iPage = pCur->iPage;
    MemPage *pPage = pCur->pPage;

    if( iPage==0 ){
      if( pPage->nOverflow ){
        /* The root page of the b-tree is overfull. In this case call the
        ** balance_deeper() function to create a new child for the root-page
        ** and copy the current contents of the root-page to it. The
        ** next iteration of the do-loop will balance the child page.
        */ 
        assert( balance_deeper_called==0 );
        VVA_ONLY( balance_deeper_called++ );
        rc = balance_deeper(pPage, &pCur->apPage[1]);
        if( rc==SQLITE_OK ){
          pCur->iPage = 1;
          pCur->ix = 0;
          pCur->aiIdx[0] = 0;
          pCur->apPage[0] = pPage;
          pCur->pPage = pCur->apPage[1];
          assert( pCur->pPage->nOverflow );
        }
      }else{
        break;
      }
    }else if( pPage->nOverflow==0 && pPage->nFree<=nMin ){
      break;
    }else{
      MemPage * const pParent = pCur->apPage[iPage-1];
      int const iIdx = pCur->aiIdx[iPage-1];

      rc = sqlite3PagerWrite(pParent->pDbPage);
      if( rc==SQLITE_OK ){
#ifndef SQLITE_OMIT_QUICKBALANCE
        if( pPage->intKeyLeaf
         && pPage->nOverflow==1
         && pPage->aiOvfl[0]==pPage->nCell
         && pParent->pgno!=1
         && pParent->nCell==iIdx
        ){
          /* Call balance_quick() to create a new sibling of pPage on which
          ** to store the overflow cell. balance_quick() inserts a new cell
          ** into pParent, which may cause pParent overflow. If this
          ** happens, the next iteration of the do-loop will balance pParent 
          ** use either balance_nonroot() or balance_deeper(). Until this
          ** happens, the overflow cell is stored in the aBalanceQuickSpace[]
          ** buffer. 
          **
          ** The purpose of the following assert() is to check that only a
          ** single call to balance_quick() is made for each call to this
          ** function. If this were not verified, a subtle bug involving reuse
          ** of the aBalanceQuickSpace[] might sneak in.
          */
          assert( balance_quick_called==0 ); 
          VVA_ONLY( balance_quick_called++ );
          rc = balance_quick(pParent, pPage, aBalanceQuickSpace);
        }else
#endif
        {
          /* In this case, call balance_nonroot() to redistribute cells
          ** between pPage and up to 2 of its sibling pages. This involves
          ** modifying the contents of pParent, which may cause pParent to
          ** become overfull or underfull. The next iteration of the do-loop
          ** will balance the parent page to correct this.
          ** 
          ** If the parent page becomes overfull, the overflow cell or cells
          ** are stored in the pSpace buffer allocated immediately below. 
          ** A subsequent iteration of the do-loop will deal with this by
          ** calling balance_nonroot() (balance_deeper() may be called first,
          ** but it doesn't deal with overflow cells - just moves them to a
          ** different page). Once this subsequent call to balance_nonroot() 
          ** has completed, it is safe to release the pSpace buffer used by
          ** the previous call, as the overflow cell data will have been 
          ** copied either into the body of a database page or into the new
          ** pSpace buffer passed to the latter call to balance_nonroot().
          */
          u8 *pSpace = sqlite3PageMalloc(pCur->pBt->pageSize);
          rc = balance_nonroot(pParent, iIdx, pSpace, iPage==1,
                               pCur->hints&BTREE_BULKLOAD);
          if( pFree ){
            /* If pFree is not NULL, it points to the pSpace buffer used 
            ** by a previous call to balance_nonroot(). Its contents are
            ** now stored either on real database pages or within the 
            ** new pSpace buffer, so it may be safely freed here. */
            sqlite3PageFree(pFree);
          }

          /* The pSpace buffer will be freed after the next call to
          ** balance_nonroot(), or just before this function returns, whichever
          ** comes first. */
          pFree = pSpace;
        }
      }

      pPage->nOverflow = 0;

      /* The next iteration of the do-loop balances the parent page. */
      releasePage(pPage);
      pCur->iPage--;
      assert( pCur->iPage>=0 );
      pCur->pPage = pCur->apPage[pCur->iPage];
    }
  }while( rc==SQLITE_OK );

  if( pFree ){
    sqlite3PageFree(pFree);
  }
  return rc;
}